

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_mristep.c
# Opt level: O2

int MRIStepInnerStepper_SetAccumulatedErrorResetFn
              (MRIStepInnerStepper stepper,MRIStepInnerResetAccumulatedError fn)

{
  int line;
  char *msgfmt;
  
  if (stepper == (MRIStepInnerStepper)0x0) {
    msgfmt = "Inner stepper memory is NULL";
    line = 0x1146;
  }
  else {
    if (stepper->ops != (MRIStepInnerStepper_Ops)0x0) {
      stepper->ops->reseterror = fn;
      return 0;
    }
    msgfmt = "Inner stepper operations structure is NULL";
    line = 0x114d;
  }
  arkProcessError((ARKodeMem)0x0,-0x16,line,"MRIStepInnerStepper_SetAccumulatedErrorResetFn",
                  "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode_mristep.c"
                  ,msgfmt);
  return -0x16;
}

Assistant:

int MRIStepInnerStepper_SetAccumulatedErrorResetFn(
  MRIStepInnerStepper stepper, MRIStepInnerResetAccumulatedError fn)
{
  if (stepper == NULL)
  {
    arkProcessError(NULL, ARK_ILL_INPUT, __LINE__, __func__, __FILE__,
                    "Inner stepper memory is NULL");
    return ARK_ILL_INPUT;
  }

  if (stepper->ops == NULL)
  {
    arkProcessError(NULL, ARK_ILL_INPUT, __LINE__, __func__, __FILE__,
                    "Inner stepper operations structure is NULL");
    return ARK_ILL_INPUT;
  }

  stepper->ops->reseterror = fn;

  return ARK_SUCCESS;
}